

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

void __thiscall QProcessPrivate::commitChannels(QProcessPrivate *this)

{
  long in_RDI;
  int in_stack_ffffffffffffffec;
  int oldfd;
  
  if (*(int *)(in_RDI + 0x1b0) != -1) {
    qt_safe_dup2((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffec);
  }
  if (*(int *)(in_RDI + 0x1ec) != -1) {
    qt_safe_dup2((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffec);
  }
  oldfd = (int)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RDI + 0x224) == -1) {
    if (*(char *)(in_RDI + 0x2a7) == '\x01') {
      qt_safe_dup2(oldfd,(int)in_RDI,in_stack_ffffffffffffffec);
    }
  }
  else {
    qt_safe_dup2(oldfd,(int)in_RDI,in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

void QProcessPrivate::commitChannels() const
{
    // copy the stdin socket if asked to (without closing on exec)
    if (stdinChannel.pipe[0] != INVALID_Q_PIPE)
        qt_safe_dup2(stdinChannel.pipe[0], STDIN_FILENO, 0);

    // copy the stdout and stderr if asked to
    if (stdoutChannel.pipe[1] != INVALID_Q_PIPE)
        qt_safe_dup2(stdoutChannel.pipe[1], STDOUT_FILENO, 0);
    if (stderrChannel.pipe[1] != INVALID_Q_PIPE) {
        qt_safe_dup2(stderrChannel.pipe[1], STDERR_FILENO, 0);
    } else {
        // merge stdout and stderr if asked to
        if (processChannelMode == QProcess::MergedChannels)
            qt_safe_dup2(STDOUT_FILENO, STDERR_FILENO, 0);
    }
}